

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboTestUtil::GradientShader::shadeFragments
          (GradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  const_reference pvVar1;
  float fVar2;
  float fVar3;
  float x_;
  undefined1 local_d0 [8];
  UVec4 uicolor;
  IVec4 icolor;
  Vector<float,_4> local_a0;
  undefined1 local_90 [8];
  Vec4 color;
  Vec4 fv;
  float f1;
  float f0;
  float y;
  float x;
  Vec4 coord;
  int fragNdx;
  int packetNdx;
  Vec4 gradientMax;
  Vec4 gradientMin;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  GradientShader *this_local;
  
  pvVar1 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                     (&(this->super_ShaderProgram).m_uniforms,0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(gradientMax.m_data + 2),(float (*) [4])&pvVar1->value);
  pvVar1 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                     (&(this->super_ShaderProgram).m_uniforms,1);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fragNdx,(float (*) [4])&pvVar1->value);
  for (coord.m_data[3] = 0.0; (int)coord.m_data[3] < numPackets;
      coord.m_data[3] = (float)((int)coord.m_data[3] + 1)) {
    for (coord.m_data[2] = 0.0; (int)coord.m_data[2] < 4;
        coord.m_data[2] = (float)((int)coord.m_data[2] + 1)) {
      rr::readTriangleVarying<float>
                ((rr *)&y,packets + (int)coord.m_data[3],context,0,(int)coord.m_data[2]);
      fVar2 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&y);
      fVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&y);
      x_ = (fVar2 + fVar3) * 0.5;
      fVar2 = (fVar2 - fVar3) * 0.5 + 0.5;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(color.m_data + 2),x_,fVar2,1.0 - x_,1.0 - fVar2);
      tcu::operator-((tcu *)(icolor.m_data + 2),(Vector<float,_4> *)&fragNdx,
                     (Vector<float,_4> *)(gradientMax.m_data + 2));
      tcu::operator*((tcu *)&local_a0,(Vector<float,_4> *)(icolor.m_data + 2),
                     (Vector<float,_4> *)(color.m_data + 2));
      tcu::operator+((tcu *)local_90,(Vector<float,_4> *)(gradientMax.m_data + 2),&local_a0);
      castVectorSaturate<int>((FboTestUtil *)(uicolor.m_data + 2),(Vec4 *)local_90);
      castVectorSaturate<unsigned_int>((FboTestUtil *)local_d0,(Vec4 *)local_90);
      if (*(int *)&(this->super_ShaderProgram).field_0x154 == 4) {
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  (context,(int)coord.m_data[3],(int)coord.m_data[2],0,(Vector<float,_4> *)local_90)
        ;
      }
      else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 0x1e) {
        rr::writeFragmentOutput<tcu::Vector<int,4>>
                  (context,(int)coord.m_data[3],(int)coord.m_data[2],0,
                   (Vector<int,_4> *)(uicolor.m_data + 2));
      }
      else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 0x22) {
        rr::writeFragmentOutput<tcu::Vector<unsigned_int,4>>
                  (context,(int)coord.m_data[3],(int)coord.m_data[2],0,
                   (Vector<unsigned_int,_4> *)local_d0);
      }
    }
  }
  return;
}

Assistant:

void GradientShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4	gradientMin(m_uniforms[0].value.f4);
	const tcu::Vec4	gradientMax(m_uniforms[1].value.f4);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
		const float			x		= coord.x();
		const float			y		= coord.y();
		const float			f0		= (x + y) * 0.5f;
		const float			f1		= 0.5f + (x - y) * 0.5f;
		const tcu::Vec4		fv		= Vec4(f0, f1, 1.0f-f0, 1.0f-f1);

		const tcu::Vec4		color	= gradientMin + (gradientMax-gradientMin) * fv;
		const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
		const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

		if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
		else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
		else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
		else
			DE_ASSERT(DE_FALSE);
	}
}